

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtualMemory.c
# Opt level: O1

_Bool sysbvm_virtualMemory_hasSupportForRWXMapping(void)

{
  int iVar1;
  void *__addr;
  
  if (sysbvm_virtualMemory_hasSupportForRWXMapping_hasCachedResult == '\0') {
    iVar1 = getpagesize();
    __addr = mmap((void *)0x0,(long)iVar1,7,0x22,-1,0);
    sysbvm_virtualMemory_hasSupportForRWXMapping::cachedResult =
         __addr != (void *)0xffffffffffffffff;
    if (sysbvm_virtualMemory_hasSupportForRWXMapping::cachedResult) {
      munmap(__addr,(long)iVar1);
    }
    sysbvm_virtualMemory_hasSupportForRWXMapping_hasCachedResult = '\x01';
  }
  return sysbvm_virtualMemory_hasSupportForRWXMapping::cachedResult;
}

Assistant:

bool sysbvm_virtualMemory_hasSupportForRWXMapping(void)
{
    static bool hasCachedResult = false;
    static bool cachedResult;

    if(!hasCachedResult)
    {
        size_t pageSize = getpagesize();
        void * result = mmap(0, pageSize, PROT_READ | PROT_WRITE | PROT_EXEC, MAP_PRIVATE | MAP_ANON, -1, 0);
        cachedResult = result != MAP_FAILED;
        if(result != MAP_FAILED)
            munmap(result, pageSize);

        hasCachedResult = true;
    }

    return cachedResult;
}